

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

bool __thiscall Protocol::MQTT::V5::WillMessage::check(WillMessage *this)

{
  bool bVar1;
  bool local_29;
  PropertyBase *local_20;
  PropertyBase *u;
  WillMessage *this_local;
  
  bVar1 = Properties::check(&this->willProperties);
  if (bVar1) {
    for (local_20 = (this->willProperties).head; local_20 != (PropertyBase *)0x0;
        local_20 = local_20->next) {
      bVar1 = isAllowedProperty((uint)local_20->type,RESERVED);
      if (!bVar1) {
        return false;
      }
    }
    bVar1 = Common::DynamicString::check(&this->willTopic);
    local_29 = false;
    if (bVar1) {
      local_29 = Common::DynamicBinaryData::check(&this->willPayload);
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool check() const
                {
                    if (!willProperties.check()) return false;
                    PropertyBase * u = willProperties.head;
                    while (u)
                    {   // Will properties are noted as if their control packet type was 0 (since it's reserved, let's use it)
                        if (!isAllowedProperty((PropertyType)u->type, (ControlPacketType)0)) return false;
                        u = u->next;
                    }
                    return willTopic.check() && willPayload.check();
                }